

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GridData.cpp
# Opt level: O2

KString * __thiscall
KDIS::DATA_TYPE::GridData::GetAsString_abi_cxx11_(KString *__return_storage_ptr__,GridData *this)

{
  ostream *poVar1;
  KINT32 Value;
  KStringStream ss;
  KString local_1c0;
  stringstream local_1a0 [16];
  ostream local_190 [376];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar1 = std::operator<<(local_190,"GridData:");
  poVar1 = std::operator<<(poVar1,"\n\tSample Type:         ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->m_ui16SmpTyp);
  poVar1 = std::operator<<(poVar1,"\n\tData Representation: ");
  ENUMS::GetEnumAsStringGridDataRepresentation_abi_cxx11_
            (&local_1c0,(ENUMS *)(ulong)this->m_ui16DtRep,Value);
  poVar1 = std::operator<<(poVar1,(string *)&local_1c0);
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString GridData::GetAsString() const
{
    KStringStream ss;

    ss << "GridData:"
       << "\n\tSample Type:         " << m_ui16SmpTyp
       << "\n\tData Representation: " << GetEnumAsStringGridDataRepresentation( m_ui16DtRep )
       << "\n";

    return ss.str();
}